

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O1

void duckdb_zstd::ZSTD_updateTree(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend)

{
  U32 mls;
  BYTE *pBVar1;
  U32 UVar2;
  uint target;
  uint uVar3;
  
  pBVar1 = (ms->window).base;
  target = (int)ip - (int)pBVar1;
  uVar3 = ms->nextToUpdate;
  if (uVar3 < target) {
    mls = (ms->cParams).minMatch;
    do {
      UVar2 = ZSTD_insertBt1(ms,pBVar1 + uVar3,iend,target,mls,0);
      uVar3 = uVar3 + UVar2;
    } while (uVar3 < target);
  }
  ms->nextToUpdate = target;
  return;
}

Assistant:

void ZSTD_updateTree(ZSTD_matchState_t* ms, const BYTE* ip, const BYTE* iend) {
    ZSTD_updateTree_internal(ms, ip, iend, ms->cParams.minMatch, ZSTD_noDict);
}